

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

u32 __thiscall irr::gui::CGUIListBox::addItem(CGUIListBox *this,wchar_t *text,s32 icon)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pLVar2;
  pointer pLVar3;
  long lVar4;
  ListItem i;
  value_type local_70;
  
  paVar1 = &local_70.Text.str.field_2;
  local_70.Text.str._M_string_length = 0;
  local_70.Text.str.field_2._M_local_buf[0] = L'\0';
  local_70.Icon = -1;
  lVar4 = 0x24;
  do {
    *(undefined1 *)((long)local_70.OverrideColors + lVar4 + -0x24) = 0;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x44);
  local_70.Text.str._M_dataplus._M_p = (pointer)paVar1;
  core::string<wchar_t>::operator=(&local_70.Text,text);
  local_70.Icon = icon;
  std::vector<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>::
  push_back(&(this->Items).m_data,&local_70);
  (this->Items).is_sorted = false;
  recalculateItemHeight(this);
  recalculateItemWidth(this,icon);
  pLVar2 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70.Text.str._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.Text.str._M_dataplus._M_p,
                    CONCAT44(local_70.Text.str.field_2._M_local_buf[1],
                             local_70.Text.str.field_2._M_local_buf[0]) * 4 + 4);
  }
  return (int)((ulong)((long)pLVar3 - (long)pLVar2) >> 3) * 0x38e38e39 - 1;
}

Assistant:

u32 CGUIListBox::addItem(const wchar_t *text, s32 icon)
{
	ListItem i;
	i.Text = text;
	i.Icon = icon;

	Items.push_back(i);
	recalculateItemHeight();
	recalculateItemWidth(icon);

	return Items.size() - 1;
}